

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  iterator __position;
  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *argument;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _List_node_base *p_Var6;
  int iVar7;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> subExpr;
  string local_98;
  string *local_78;
  cmExpandedCommandArgument local_70;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_48;
  
  p_Var1 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  do {
    bVar3 = p_Var1 == (_List_node_base *)newArgs;
    if (bVar3) {
      return bVar3;
    }
    argument = (list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               (p_Var1 + 1);
    keyword.super_string_view._M_str = DAT_00ad0fe8;
    keyword.super_string_view._M_len = (anonymous_namespace)::keyParenL;
    bVar4 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)argument);
    if (bVar4) {
      p_Var6 = (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                &p_Var1->_M_next)->
               super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      local_78 = (string *)argument;
      if (p_Var6 == (_List_node_base *)newArgs) {
        bVar4 = true;
      }
      else {
        iVar7 = 1;
        do {
          keyword_00.super_string_view._M_str = DAT_00ad0fe8;
          keyword_00.super_string_view._M_len = (anonymous_namespace)::keyParenL;
          bVar4 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(p_Var6 + 1));
          keyword_01.super_string_view._M_str = DAT_00ad0ff8;
          keyword_01.super_string_view._M_len = (anonymous_namespace)::keyParenR;
          bVar5 = IsKeyword(this,keyword_01,(cmExpandedCommandArgument *)(p_Var6 + 1));
          iVar7 = (iVar7 + (uint)bVar4) - (uint)bVar5;
          bVar4 = iVar7 != 0;
          p_Var6 = p_Var6->_M_next;
          if (p_Var6 == (_List_node_base *)newArgs) break;
        } while (iVar7 != 0);
      }
      if (bVar4) {
        std::__cxx11::string::_M_replace
                  ((ulong)errorString,0,(char *)errorString->_M_string_length,0x87f608);
        *status = FATAL_ERROR;
      }
      else {
        std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
        vector<std::_List_iterator<cmExpandedCommandArgument>,void>
                  ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                   &local_48,
                   (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                    &p_Var1->_M_next)->
                   super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   )._M_impl._M_node.super__List_node_base._M_next,p_Var6->_M_prev,
                   (allocator_type *)&local_70);
        IsTrue(this,&local_48,errorString,status);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_98,'\x01');
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_70,&local_98,true);
        std::__cxx11::string::operator=(local_78,(string *)&local_70);
        *(bool *)&(((cmArgumentList *)(p_Var1 + 3))->
                  super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>)
                  .
                  super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl._M_node.super__List_node_base._M_next = local_70.Quoted;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
          operator_delete(local_70.Value._M_dataplus._M_p,
                          local_70.Value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        __position._M_node =
             (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &p_Var1->_M_next)->
             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
             )._M_impl._M_node.super__List_node_base._M_next;
        while (__position._M_node != p_Var6) {
          p_Var2 = (__position._M_node)->_M_next;
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(&newArgs->
                      super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                     ,__position);
          __position._M_node = p_Var2;
        }
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                  (&local_48);
      }
      if (bVar4) {
        return bVar3;
      }
    }
    p_Var1 = (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &p_Var1->_M_next)->
             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto arg = newArgs.begin(); arg != newArgs.end(); ++arg) {
    if (this->IsKeyword(keyParenL, *arg)) {
      // search for the closing paren for this opening one
      auto depth = 1;
      auto argClose = std::next(arg);
      for (; argClose != newArgs.end() && depth; ++argClose) {
        depth += int(this->IsKeyword(keyParenL, *argClose)) -
          int(this->IsKeyword(keyParenR, *argClose));
      }
      if (depth) {
        errorString = "mismatched parenthesis in condition";
        status = MessageType::FATAL_ERROR;
        return false;
      }

      // store the reduced args in this vector
      auto argOpen = std::next(arg);
      const std::vector<cmExpandedCommandArgument> subExpr(
        argOpen, std::prev(argClose));

      // now recursively invoke IsTrue to handle the values inside the
      // parenthetical expression
      const auto value = this->IsTrue(subExpr, errorString, status);
      *arg = cmExpandedCommandArgument(bool2string(value), true);
      argOpen = std::next(arg);
      // remove the now evaluated parenthetical expression
      newArgs.erase(argOpen, argClose);
    }
  }
  return true;
}